

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_os_get_group(uv_group_t *grp,uv_uid_t gid)

{
  int iVar1;
  char *__buffer;
  size_t sVar2;
  size_t sVar3;
  char **ppcVar4;
  int local_7c;
  long lStack_78;
  int r;
  size_t mem_size;
  long members;
  size_t name_size;
  size_t bufsize;
  char *gr_mem;
  char *buf;
  group *result;
  group gp;
  uv_uid_t gid_local;
  uv_group_t *grp_local;
  
  if (grp == (uv_group_t *)0x0) {
    grp_local._4_4_ = -0x16;
  }
  else {
    name_size = 2000;
    gp.gr_mem._4_4_ = gid;
    while (__buffer = (char *)uv__malloc(name_size), __buffer != (char *)0x0) {
      do {
        iVar1 = getgrgid_r(gp.gr_mem._4_4_,(group *)&result,__buffer,name_size,(group **)&buf);
      } while (iVar1 == 4);
      if ((iVar1 != 0) || (buf == (char *)0x0)) {
        uv__free(__buffer);
      }
      if (iVar1 != 0x22) {
        if (iVar1 != 0) {
          return -iVar1;
        }
        if (buf == (char *)0x0) {
          return -2;
        }
        sVar2 = strlen((char *)result);
        mem_size = 0;
        lStack_78 = 8;
        local_7c = 0;
        while (*(long *)(gp._16_8_ + (long)local_7c * 8) != 0) {
          sVar3 = strlen(*(char **)(gp._16_8_ + (long)local_7c * 8));
          lStack_78 = sVar3 + 9 + lStack_78;
          mem_size = mem_size + 1;
          local_7c = local_7c + 1;
        }
        ppcVar4 = (char **)uv__malloc(sVar2 + 1 + lStack_78);
        if (ppcVar4 == (char **)0x0) {
          uv__free(__buffer);
          return -0xc;
        }
        grp->members = ppcVar4;
        grp->members[mem_size] = (char *)0x0;
        bufsize = (size_t)(grp->members + mem_size + 1);
        for (local_7c = 0; (long)local_7c < (long)mem_size; local_7c = local_7c + 1) {
          grp->members[local_7c] = (char *)bufsize;
          strcpy((char *)bufsize,*(char **)(gp._16_8_ + (long)local_7c * 8));
          sVar3 = strlen((char *)bufsize);
          bufsize = sVar3 + 1 + bufsize;
        }
        if (bufsize == (long)grp->members + lStack_78) {
          grp->groupname = (char *)bufsize;
          memcpy(grp->groupname,result,sVar2 + 1);
          grp->gid = (ulong)(uint)gp.gr_passwd;
          uv__free(__buffer);
          return 0;
        }
        __assert_fail("gr_mem == (char*)grp->members + mem_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/core.c"
                      ,0x53d,"int uv_os_get_group(uv_group_t *, uv_uid_t)");
      }
      name_size = name_size << 1;
    }
    grp_local._4_4_ = -0xc;
  }
  return grp_local._4_4_;
}

Assistant:

int uv_os_get_group(uv_group_t* grp, uv_uid_t gid) {
#if defined(__ANDROID__) && __ANDROID_API__ < 24
  /* This function getgrgid_r() was added in Android N (level 24) */
  return UV_ENOSYS;
#else
  struct group gp;
  struct group* result;
  char* buf;
  char* gr_mem;
  size_t bufsize;
  size_t name_size;
  long members;
  size_t mem_size;
  int r;

  if (grp == NULL)
    return UV_EINVAL;

  /* Calling sysconf(_SC_GETGR_R_SIZE_MAX) would get the suggested size, but it
   * is frequently 1024 or 4096, so we can just use that directly. The pwent
   * will not usually be large. */
  for (bufsize = 2000;; bufsize *= 2) {
    buf = uv__malloc(bufsize);

    if (buf == NULL)
      return UV_ENOMEM;

    do
      r = getgrgid_r(gid, &gp, buf, bufsize, &result);
    while (r == EINTR);

    if (r != 0 || result == NULL)
      uv__free(buf);

    if (r != ERANGE)
      break;
  }

  if (r != 0)
    return UV__ERR(r);

  if (result == NULL)
    return UV_ENOENT;

  /* Allocate memory for the groupname and members. */
  name_size = strlen(gp.gr_name) + 1;
  members = 0;
  mem_size = sizeof(char*);
  for (r = 0; gp.gr_mem[r] != NULL; r++) {
    mem_size += strlen(gp.gr_mem[r]) + 1 + sizeof(char*);
    members++;
  }

  gr_mem = uv__malloc(name_size + mem_size);
  if (gr_mem == NULL) {
    uv__free(buf);
    return UV_ENOMEM;
  }

  /* Copy the members */
  grp->members = (char**) gr_mem;
  grp->members[members] = NULL;
  gr_mem = (char*) &grp->members[members + 1];
  for (r = 0; r < members; r++) {
    grp->members[r] = gr_mem;
    strcpy(gr_mem, gp.gr_mem[r]);
    gr_mem += strlen(gr_mem) + 1;
  }
  assert(gr_mem == (char*)grp->members + mem_size);

  /* Copy the groupname */
  grp->groupname = gr_mem;
  memcpy(grp->groupname, gp.gr_name, name_size);
  gr_mem += name_size;

  /* Copy the gid */
  grp->gid = gp.gr_gid;

  uv__free(buf);

  return 0;
#endif
}